

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

void __thiscall ON_Matrix::Zero(ON_Matrix *this)

{
  int *piVar1;
  void **ppvVar2;
  
  ppvVar2 = &this->m_cmem;
  while (piVar1 = (int *)*ppvVar2, piVar1 != (int *)0x0) {
    if ((*(void **)(piVar1 + 2) != (void *)0x0) && (0 < (long)*piVar1)) {
      memset(*(void **)(piVar1 + 2),0,(long)*piVar1 << 3);
    }
    onmalloc(0);
    ppvVar2 = (void **)(piVar1 + 4);
  }
  return;
}

Assistant:

void ON_Matrix::Zero()
{
  struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
  while ( 0 != cmem )
  {
    if ( 0 != cmem->a && cmem->count > 0 )
    {
      memset( cmem->a, 0, cmem->count*sizeof(cmem->a[0]) );
    }
    onmalloc(0);  // allow canceling
    cmem = cmem->next;
  }

  //m_a.Zero();
}